

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O0

bool __thiscall
supermap::BloomFilter<supermap::Key<128UL>_>::mightContain
          (BloomFilter<supermap::Key<128UL>_> *this,Key<128UL> *value)

{
  bool bVar1;
  IllegalStateException *this_00;
  size_type in_RDI;
  uint64_t index;
  unsigned_long *seed;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  string data;
  Key<128UL> *in_stack_000000e0;
  BloomFilter<supermap::Key<128UL>_> *in_stack_000000e8;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  BloomFilter<supermap::Key<128UL>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff80;
  string local_70 [35];
  undefined1 local_4d;
  string local_38 [55];
  byte local_1;
  
  bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff80._M_current);
  if (bVar1) {
    local_4d = 1;
    this_00 = (IllegalStateException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70);
    supermap::IllegalStateException::IllegalStateException(this_00,local_38);
    local_4d = 0;
    __cxa_throw(this_00,&IllegalStateException::typeinfo,
                IllegalStateException::~IllegalStateException);
  }
  BloomFilter<supermap::Key<128ul>>::serialize_abi_cxx11_(in_stack_000000e8,in_stack_000000e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff40,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (!bVar1) {
      local_1 = 1;
LAB_00287968:
      std::__cxx11::string::~string(local_70);
      return (bool)(local_1 & 1);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)&stack0xffffffffffffff80);
    in_stack_ffffffffffffff40 =
         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)getHashWithSeed(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                            (XXH64_hash_t)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff3f =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)
                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RDI);
    if (!(bool)in_stack_ffffffffffffff3f) {
      local_1 = 0;
      goto LAB_00287968;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&stack0xffffffffffffff80);
  } while( true );
}

Assistant:

bool mightContain(const T &value) const override {
        if (elements_.empty()) {
            throw supermap::IllegalStateException("Filter size was not reserved or was set to zero");
        }
        std::string data = serialize(value);
        for (auto &seed : seeds_) {
            std::uint64_t index = getHashWithSeed(data, seed);
            if (!elements_[index]) {
                return false;
            }
        }
        return true;
    }